

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::add_flag(App *this,string *flag_name)

{
  Option *pOVar1;
  string local_78;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)flag_name);
  local_48 = 0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pOVar1 = _add_flag_internal(this,&local_30,(callback_t *)&local_58,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_30);
  return pOVar1;
}

Assistant:

Option *add_flag(std::string flag_name) { return _add_flag_internal(flag_name, CLI::callback_t(), std::string{}); }